

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O2

back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>
fmt::v8::detail::copy_str<char8_t,char*,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>>
          (char *begin,char *end,back_insert_iterator<fmt::v8::detail::buffer<char8_t>_> out)

{
  undefined8 in_RAX;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  for (; begin != end; begin = begin + 1) {
    uStack_28 = CONCAT17(*begin,(undefined7)uStack_28);
    buffer<char8_t>::push_back(out.container,(char8_t *)((long)&uStack_28 + 7));
  }
  return (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)out.container;
}

Assistant:

FMT_CONSTEXPR auto copy_str(InputIt begin, InputIt end, OutputIt out)
    -> OutputIt {
  while (begin != end) *out++ = static_cast<Char>(*begin++);
  return out;
}